

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O3

void xercesc_4_0::XMLInitializer::initializeDatatypeValidatorFactory(void)

{
  DatatypeValidatorFactory *this;
  size_t in_RSI;
  
  this = (DatatypeValidatorFactory *)XMemory::operator_new((XMemory *)0x18,in_RSI);
  DatatypeValidatorFactory::DatatypeValidatorFactory(this,XMLPlatformUtils::fgMemoryManager);
  if (this != (DatatypeValidatorFactory *)0x0) {
    DatatypeValidatorFactory::expandRegistryToFullSchemaSet(this);
    (*(this->super_XSerializable)._vptr_XSerializable[1])(this);
    return;
  }
  return;
}

Assistant:

void XMLInitializer::initializeDatatypeValidatorFactory()
{
    // @@ This is ugly. Need to make expandRegistryToFullSchemaSet
    // static.
    //
    DatatypeValidatorFactory *dvFactory = new DatatypeValidatorFactory();
    if (dvFactory) {
        dvFactory->expandRegistryToFullSchemaSet();
        delete dvFactory;
    }
}